

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor_extras.c
# Opt level: O0

int triggerize_fanout_inplace(_glist *x,t_object *obj)

{
  int iVar1;
  t_object *ptVar2;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  void *data;
  _outconnect *conn_00;
  _outconnect *conn_1;
  _outlet *out_1;
  _inlet *in;
  t_object *dest;
  _outconnect *p_Stack_60;
  int which;
  _outconnect *conn;
  _outlet *out;
  t_object *stub;
  _binbuf *b;
  int local_38;
  int newout;
  int nout;
  int obj_nout;
  t_atom *argv;
  int posY;
  int posX;
  t_object *obj_local;
  _glist *x_local;
  
  argv._4_4_ = (uint)obj->te_xpix;
  argv._0_4_ = (uint)obj->te_ypix;
  _posY = obj;
  obj_local = &x->gl_obj;
  _nout = binbuf_getvec(obj->te_binbuf);
  newout = obj_noutlets(_posY);
  stub = (t_object *)0x0;
  out = (_outlet *)0x0;
  iVar1 = has_fanout(_posY);
  if (iVar1 == 0) {
    x_local._4_4_ = 0;
  }
  else {
    ptVar2 = (t_object *)binbuf_new();
    stub = ptVar2;
    ptVar3 = gensym("#X");
    ptVar4 = gensym("obj");
    binbuf_addv((_binbuf *)ptVar2,"ssii",ptVar3,ptVar4,(ulong)argv._4_4_,(ulong)(uint)argv);
    binbuf_add((_binbuf *)stub,1,_nout);
    for (local_38 = 0; _nout = _nout + 1, local_38 < newout; local_38 = local_38 + 1) {
      conn = (_outconnect *)0x0;
      p_Stack_60 = obj_starttraverseoutlet(_posY,(_outlet **)&conn,local_38);
      while (p_Stack_60 != (_outconnect *)0x0) {
        in = (_inlet *)0x0;
        out_1 = (_outlet *)0x0;
        p_Stack_60 = obj_nexttraverseoutlet
                               (p_Stack_60,(t_object **)&in,(_inlet **)&out_1,
                                (int *)((long)&dest + 4));
        binbuf_add((_binbuf *)stub,1,_nout);
      }
    }
    binbuf_addsemi((_binbuf *)stub);
    ptVar2 = obj_local;
    data = canvas_undo_set_pastebinbuf((_glist *)obj_local,(_binbuf *)stub,0,0,0);
    canvas_undo_add((_glist *)ptVar2,UNDO_PASTE,"paste",data);
    out = (_outlet *)triggerize_createobj((_glist *)obj_local,(_binbuf *)stub);
    binbuf_free((_binbuf *)stub);
    b._4_4_ = 0;
    dereconnect((_glist *)obj_local,_posY,(t_object *)out);
    for (local_38 = 0; local_38 < newout; local_38 = local_38 + 1) {
      conn_1 = (_outconnect *)0x0;
      conn_00 = obj_starttraverseoutlet(_posY,(_outlet **)&conn_1,local_38);
      stack_conn((_glist *)obj_local,(t_object *)out,(int *)((long)&b + 4),_posY,local_38,conn_00);
    }
    obj_delete_undo((_glist *)obj_local,_posY);
    x_local._4_4_ = 1;
  }
  return x_local._4_4_;
}

Assistant:

static int triggerize_fanout_inplace(t_glist*x, t_object*obj)
{
        /* avoid fanouts in [t] objects by adding additional outlets */

    int posX=obj->te_xpix;
    int posY=obj->te_ypix;
    t_atom*argv=binbuf_getvec(obj->te_binbuf);
    int obj_nout=obj_noutlets(obj);
    int nout, newout;
    t_binbuf*b=0;
    t_object*stub=0;
        /* check if we actually do have a fan out */
    if(!has_fanout(obj))return 0;
        /* create a new trigger object, that has outlets for the fans */
    b=binbuf_new();
    binbuf_addv(b, "ssii", gensym("#X"), gensym("obj"), posX, posY);
    binbuf_add(b, 1, argv);
    argv++;
    for(nout=0; nout<obj_nout; nout++)
    {
        t_outlet*out=0;
        t_outconnect*conn=obj_starttraverseoutlet(obj, &out, nout);
        while(conn)
        {
            int which;
            t_object*dest=0;
            t_inlet *in =0;
            conn=obj_nexttraverseoutlet(conn, &dest, &in, &which);
            binbuf_add(b, 1, argv);
        }
        argv++;
    }
    binbuf_addsemi(b);
    canvas_undo_add(x, UNDO_PASTE, "paste",
        canvas_undo_set_pastebinbuf(x, b, 0, 0, 0));
    stub=triggerize_createobj(x, b);
    binbuf_free(b);

        /* connect */
    newout=0;
    dereconnect(x, obj, stub);
    for(nout=0; nout<obj_nout; nout++)
    {
        t_outlet*out=0;
        t_outconnect*conn=obj_starttraverseoutlet(obj, &out, nout);
        stack_conn(x, stub, &newout, obj, nout, conn);
    }

        /* free old object */
    obj_delete_undo(x, obj);
    return 1;
}